

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

target_ulong_conflict helper_mftc0_tccontext_mips(CPUMIPSState *env)

{
  uint32_t uVar1;
  CPUMIPSState *pCVar2;
  uint32_t uVar3;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar1 = env->current_tc;
    uVar3 = uVar1;
  }
  else {
    uVar3 = (uint32_t)
            ((long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c));
    uVar1 = env->current_tc;
  }
  pCVar2 = (CPUMIPSState *)(env->tcs + (int)uVar3);
  if (uVar3 == uVar1) {
    pCVar2 = env;
  }
  return (pCVar2->active_tc).CP0_TCContext;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}